

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall clickhouse::SocketOutput::~SocketOutput(SocketOutput *this)

{
  ~SocketOutput(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

void SocketOutput::DoWrite(const void* data, size_t len) {
#if defined (_linux_)
    static const int flags = MSG_NOSIGNAL;
#else
    static const int flags = 0;
#endif

    if (::send(s_, (const char*)data, (int)len, flags) != (int)len) {
        throw std::system_error(
            errno, std::system_category(), "fail to send data"
        );
    }
}